

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::TENSOR_INITIALIZING_1_Test::TestBody(TENSOR_INITIALIZING_1_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  AssertHelper local_108;
  Message local_100;
  int local_f8;
  array<unsigned_int,_1UL> local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_d0;
  array<unsigned_int,_1UL> local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  int local_a8;
  array<unsigned_int,_1UL> local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  allocator<int> local_79;
  int local_78 [6];
  iterator local_60;
  size_type local_58;
  vector<int,_std::allocator<int>_> local_50;
  undefined1 local_38 [8];
  tensor<int,_1U> ts;
  TENSOR_INITIALIZING_1_Test *this_local;
  
  local_78[0] = 1;
  local_78[1] = 2;
  local_78[2] = 3;
  local_78[3] = 4;
  local_78[4] = 5;
  local_60 = local_78;
  local_58 = 5;
  ts._32_8_ = this;
  std::allocator<int>::allocator(&local_79);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_79);
  gtest_ar.message_.ptr_._0_4_ = 5;
  dnet::data_types::tensor<int,_1U>::tensor
            ((tensor<int,_1U> *)local_38,&local_50,(array<unsigned_int,_1UL>)0x5);
  std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  std::allocator<int>::~allocator(&local_79);
  local_a4._M_elems[0] = (_Type)0;
  piVar2 = dnet::data_types::tensor<int,_1U>::operator[]((tensor<int,_1U> *)local_38,&local_a4);
  local_a8 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a0,"(ts[{0}])","1",piVar2,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_cc._M_elems[0] = (_Type)1;
  piVar2 = dnet::data_types::tensor<int,_1U>::operator[]((tensor<int,_1U> *)local_38,&local_cc);
  local_d0 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c8,"(ts[{1}])","2",piVar2,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f4._M_elems[0] = (_Type)3;
  piVar2 = dnet::data_types::tensor<int,_1U>::operator[]((tensor<int,_1U> *)local_38,&local_f4);
  local_f8 = 4;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_f0,"(ts[{3}])","4",piVar2,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  dnet::data_types::tensor<int,_1U>::~tensor((tensor<int,_1U> *)local_38);
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_1) {
        tensor<int, 1> ts({1,2,3,4,5}, {5});
        EXPECT_EQ((ts[{0}]), 1);
        EXPECT_EQ((ts[{1}]), 2);
        EXPECT_EQ((ts[{3}]), 4);
    }